

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors::Shader1_abi_cxx11_
          (string *__return_storage_ptr__,NegativeGLSLCompileTimeErrors *this,int x,int y,int z)

{
  ostream *poVar1;
  string *psVar2;
  stringstream ss;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"#version 430 core\nlayout(local_size_x = ",0x28);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,(int)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", local_size_y = ",0x11);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", local_size_z = ",0x11);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             ") in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = 0;\n}"
             ,0x73);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  psVar2 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return psVar2;
}

Assistant:

static std::string Shader1(int x, int y, int z)
	{
		std::stringstream ss;
		ss << "#version 430 core" NL "layout(local_size_x = " << x << ", local_size_y = " << y
		   << ", local_size_z = " << z << ") in;" NL "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL
										  "void main() {" NL "  g_output[gl_GlobalInvocationID.x] = 0;" NL "}";
		return ss.str();
	}